

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::values::detail::SignedCheck<int,true>::operator()
          (SignedCheck<int,true> *this,bool negative,uint u,string *text)

{
  argument_incorrect_type *this_00;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,negative) == 0) {
    if (-1 < (int)u) {
      return;
    }
    this_00 = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(this_00,text);
  }
  else {
    if (u < 0x80000001) {
      return;
    }
    this_00 = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(this_00,text);
  }
  __cxa_throw(this_00,&argument_incorrect_type::typeinfo,OptionException::~OptionException);
}

Assistant:

void
                operator()(bool negative, U u, const std::string& text)
                {
                    if (negative)
                    {
                        if (u > static_cast<U>(-std::numeric_limits<T>::min()))
                        {
                            throw argument_incorrect_type(text);
                        }
                    }
                    else
                    {
                        if (u > static_cast<U>(std::numeric_limits<T>::max()))
                        {
                            throw argument_incorrect_type(text);
                        }
                    }
                }